

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerProduct.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeInnnerProduct(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  uint32 uVar5;
  string *psVar6;
  string *layerType;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  reference __x;
  reference __lhs;
  BlobProto *pBVar8;
  BlobShape *pBVar9;
  WeightParams *pWVar10;
  RepeatedField<float> *pRVar11;
  NetParameter *in_stack_00000008;
  float local_62c;
  RepeatedField<float> *local_628;
  RepeatedField<float> *biasWrite;
  string local_618;
  string local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  float local_534;
  RepeatedField<float> *local_530;
  RepeatedField<float> *weightsWrite;
  string local_520;
  string local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  int local_43c;
  int iStack_438;
  int caffeBlobSizeWeights;
  int64_t blobSize;
  string local_428;
  string local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  uint64 local_238;
  int64_t caffeBiasLength;
  ulong uStack_228;
  bool hasBias;
  uint64_t numOutput;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  unsigned_long local_1d0;
  int64_t outputChannels;
  int64_t inputChannels;
  InnerProductParameter *caffeLayerParams;
  InnerProductLayerParams *specLayerParams;
  NeuralNetworkLayer *specLayer;
  FlattenLayerParams *flatten_params;
  NeuralNetworkLayer *local_180;
  NeuralNetworkLayer *specLayer_flatten;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top_flatten;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_51;
  string local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayerWeights;
  LayerParameter *pLStack_18;
  int layerIdWeights;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  pLStack_18 = caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  caffeLayerWeights._4_4_ =
       getLayerIndex(pLStack_18,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)layerParameters.mappingDataBlobNames);
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(layerParameters.prototxt,caffeLayerWeights._4_4_);
  local_30 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)layerParameters._24_8_;
  iVar3 = caffe::LayerParameter::bottom_size(pLStack_18);
  if (iVar3 == 1) {
    iVar3 = caffe::LayerParameter::top_size(pLStack_18);
    if (iVar3 == 1) goto LAB_0072d7ee;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
  psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  layerType = caffe::LayerParameter::type_abi_cxx11_(pLStack_18);
  errorInCaffeProto(&local_50,psVar6,layerType);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
LAB_0072d7ee:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar7 = caffe::LayerParameter::bottom_abi_cxx11_(pLStack_18);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar7);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar7);
  while( true ) {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(iterator *)&bottomName);
    if (!bVar2) break;
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar7 = caffe::LayerParameter::top_abi_cxx11_(pLStack_18);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar7);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar7);
  while( true ) {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1_1,(iterator *)&topName);
    if (!bVar2) break;
    top_flatten.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,
                top_flatten.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f0);
  __lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&top.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::operator+(&local_150,__lhs,"_");
  std::__cxx11::to_string((string *)&nnWrite,caffeLayer._4_4_);
  std::operator+(&local_130,&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nnWrite);
  std::operator+(&local_110,&local_130,"_flattened");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&nnWrite);
  std::__cxx11::string::~string((string *)&local_150);
  specLayer_flatten = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_180 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                        ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                         layerParameters.protoweights);
  psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &flatten_params,psVar6,"_preflatten");
  convertCaffeMetadata
            ((string *)&flatten_params,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&top.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f0,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer_flatten,
             local_30);
  std::__cxx11::string::~string((string *)&flatten_params);
  specLayer = (NeuralNetworkLayer *)
              CoreML::Specification::NeuralNetworkLayer::mutable_flatten(local_180);
  CoreML::Specification::FlattenLayerParams::set_mode
            ((FlattenLayerParams *)specLayer,FlattenLayerParams_FlattenOrder_CHANNEL_FIRST);
  specLayerParams =
       (InnerProductLayerParams *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                 ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer_flatten);
  psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
  convertCaffeMetadata
            (psVar6,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer_flatten,
             local_30);
  caffeLayerParams =
       (InnerProductParameter *)
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)specLayerParams);
  inputChannels = (int64_t)caffe::LayerParameter::inner_product_param(pLStack_18);
  outputChannels = 0;
  local_1d0 = 0;
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,"Weight blobs not provided",&local_1f1);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_218,"Innerproduct",(allocator *)((long)&numOutput + 7));
    errorInCaffeProto(&local_1f0,psVar6,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)((long)&numOutput + 7));
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  pBVar9 = caffe::BlobProto::shape(pBVar8);
  iVar3 = caffe::BlobShape::dim_size(pBVar9);
  if (iVar3 == 0) {
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    iVar4 = caffe::BlobProto::height(pBVar8);
    local_1d0 = (unsigned_long)iVar4;
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    iVar4 = caffe::BlobProto::width(pBVar8);
    outputChannels = (int64_t)iVar4;
  }
  else {
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar9 = caffe::BlobProto::shape(pBVar8);
    local_1d0 = caffe::BlobShape::dim(pBVar9,0);
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pBVar9 = caffe::BlobProto::shape(pBVar8);
    outputChannels = caffe::BlobShape::dim(pBVar9,1);
  }
  uVar5 = caffe::InnerProductParameter::num_output((InnerProductParameter *)inputChannels);
  uStack_228 = (ulong)uVar5;
  caffeBiasLength._7_1_ =
       caffe::InnerProductParameter::bias_term((InnerProductParameter *)inputChannels);
  local_238 = 0;
  iVar3 = caffe::LayerParameter::blobs_size((LayerParameter *)mappingDataBlobNames);
  if (1 < iVar3) {
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
    iVar3 = caffe::BlobProto::data_size(pBVar8);
    local_238 = (uint64)iVar3;
  }
  bVar2 = caffe::InnerProductParameter::transpose((InnerProductParameter *)inputChannels);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"transpose",&local_259);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"Inner Product",&local_281);
    unsupportedCaffeParrameter(&local_258,psVar6,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
  }
  iVar4 = caffe::InnerProductParameter::axis((InnerProductParameter *)inputChannels);
  if (iVar4 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"axis",&local_2a9);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d0,"Inner Product",&local_2d1);
    iVar4 = caffe::InnerProductParameter::axis((InnerProductParameter *)inputChannels);
    std::__cxx11::to_string(&local_2f8,iVar4);
    unsupportedCaffeParrameterWithOption(&local_2a8,psVar6,&local_2d0,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  if ((((caffeBiasLength._7_1_ & 1) != 0) && (local_238 == 0)) ||
     (((caffeBiasLength._7_1_ & 1) == 0 && (0 < (long)local_238)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_318,"\'bias_term\' flag and blob size for bias incompatible",
               &local_319);
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"Inner Product",&local_341);
    errorInCaffeProto(&local_318,psVar6,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
  }
  if ((long)local_1d0 < 0) {
    __assert_fail("outputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x5f,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  if (local_1d0 != uStack_228) {
    std::__cxx11::to_string(&local_3e8,uStack_228);
    std::operator+(&local_3c8,"\'num_output\' (",&local_3e8);
    std::operator+(&local_3a8,&local_3c8,
                   ") does not match the first dimension of the weight matrix (");
    std::__cxx11::to_string(&local_408,local_1d0);
    std::operator+(&local_388,&local_3a8,&local_408);
    std::operator+(&local_368,&local_388,")");
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_428,"Inner Product",(allocator *)((long)&blobSize + 7));
    errorInCaffeProto(&local_368,psVar6,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)((long)&blobSize + 7));
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
  }
  if (outputChannels < 0) {
    __assert_fail("inputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x66,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  CoreML::Specification::InnerProductLayerParams::set_inputchannels
            ((InnerProductLayerParams *)caffeLayerParams,outputChannels);
  if ((long)local_1d0 < 0) {
    __assert_fail("outputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x69,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)caffeLayerParams,local_1d0);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)caffeLayerParams,(bool)(caffeBiasLength._7_1_ & 1));
  _iStack_438 = outputChannels * local_1d0;
  pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
  local_43c = caffe::BlobProto::data_size(pBVar8);
  if (local_43c != _iStack_438) {
    std::__cxx11::to_string(&local_4e0,_iStack_438);
    std::operator+(&local_4c0,"Expected blob size = ",&local_4e0);
    std::operator+(&local_4a0,&local_4c0," but found blob of size = ");
    std::__cxx11::to_string(&local_500,local_43c);
    std::operator+(&local_480,&local_4a0,&local_500);
    std::operator+(&local_460,&local_480," in caffe");
    psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_520,"Inner Product",(allocator *)((long)&weightsWrite + 7));
    errorInCaffeProto(&local_460,psVar6,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)((long)&weightsWrite + 7));
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  pWVar10 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                      ((InnerProductLayerParams *)caffeLayerParams);
  local_530 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
  if (_iStack_438 < 0x80000000) {
    local_534 = 0.0;
    google::protobuf::RepeatedField<float>::Resize(local_530,iStack_438,&local_534);
    pRVar1 = local_530;
    pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,0);
    pRVar11 = caffe::BlobProto::data(pBVar8);
    google::protobuf::RepeatedField<float>::CopyFrom(pRVar1,pRVar11);
    if ((caffeBiasLength._7_1_ & 1) != 0) {
      if (local_238 != local_1d0) {
        std::__cxx11::to_string(&local_5d8,local_1d0);
        std::operator+(&local_5b8,"Expected blob size = ",&local_5d8);
        std::operator+(&local_598,&local_5b8," but found blob of size = ");
        std::__cxx11::to_string(&local_5f8,local_238);
        std::operator+(&local_578,&local_598,&local_5f8);
        std::operator+(&local_558,&local_578," in caffe");
        psVar6 = caffe::LayerParameter::name_abi_cxx11_(pLStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_618,"Inner Product",(allocator *)((long)&biasWrite + 7));
        errorInCaffeProto(&local_558,psVar6,&local_618);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator((allocator<char> *)((long)&biasWrite + 7));
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_5d8);
      }
      pWVar10 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                          ((InnerProductLayerParams *)caffeLayerParams);
      local_628 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar10);
      if (0x7fffffff < (long)local_1d0) {
        __assert_fail("outputChannels <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                      ,0x81,
                      "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                     );
      }
      local_62c = 0.0;
      google::protobuf::RepeatedField<float>::Resize(local_628,(int)local_1d0,&local_62c);
      pRVar1 = local_628;
      pBVar8 = caffe::LayerParameter::blobs((LayerParameter *)mappingDataBlobNames,1);
      pRVar11 = caffe::BlobProto::data(pBVar8);
      google::protobuf::RepeatedField<float>::CopyFrom(pRVar1,pRVar11);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&top.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("blobSize <= INT_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                ,0x75,
                "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
               );
}

Assistant:

void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    
    //We add two layers for the inner product layer: flatten + innerproduct
    std::vector<std::string> top_flatten;
    top_flatten.push_back(bottom[0] + "_" + std::to_string(layerId) + "_flattened");
    auto* nnWrite = layerParameters.nnWrite;
    
    //first write flatten
    Specification::NeuralNetworkLayer* specLayer_flatten = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_preflatten",
                                         bottom, top_flatten, nnWrite, mappingDataBlobNames);
    
    Specification::FlattenLayerParams* flatten_params = specLayer_flatten->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
    
    //now write inner product
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         top_flatten, top, nnWrite, mappingDataBlobNames);
    
    Specification::InnerProductLayerParams* specLayerParams = specLayer->mutable_innerproduct();
    const caffe::InnerProductParameter& caffeLayerParams = caffeLayer.inner_product_param();
    int64_t inputChannels = 0;
    int64_t outputChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto(
            "Weight blobs not provided", caffeLayer.name(), "Innerproduct");
    }
    
    // Sometimes caffe models do not populate the shape (infering from other parameters)
    if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
        outputChannels = caffeLayerWeights.blobs(0).height();
        inputChannels = caffeLayerWeights.blobs(0).width();
    } else {
        outputChannels = caffeLayerWeights.blobs(0).shape().dim(0);
        inputChannels = caffeLayerWeights.blobs(0).shape().dim(1);
    }

    uint64_t numOutput = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int64_t caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.transpose() == true) {
        CoreMLConverter::unsupportedCaffeParrameter("transpose",caffeLayer.name(), "Inner Product");
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis", caffeLayer.name(), "Inner Product",
                                  std::to_string(caffeLayerParams.axis()));
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), "Inner Product");
    }
    assert(outputChannels >= 0);
    if (static_cast<uint64_t>(outputChannels) != numOutput) {
        CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(numOutput)+") does not match the first dimension of the weight matrix ("+std::to_string(outputChannels)+")"
                                          ,caffeLayer.name(), "Inner Product");
    }
    //**************************************************************
    
    assert(inputChannels >= 0);
    specLayerParams->set_inputchannels(static_cast<uint64_t>(inputChannels));

    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights
    int64_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int32_t>(blobSize), 0.0);
    weightsWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    
    // Write bias 
    if (hasBias) {
        if (caffeBiasLength != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int32_t>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}